

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

_func_void_uchar_ptr_uchar_ptr_int_int_uchar_ptr_int ** __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>
::Iterator::Current(Iterator *this)

{
  pointer pp_Var1;
  undefined8 *puVar2;
  reference pp_Var3;
  long in_RDI;
  pointer in_stack_ffffffffffffffd8;
  unique_ptr<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::default_delete<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>_>
  *in_stack_ffffffffffffffe0;
  
  pp_Var1 = std::
            unique_ptr<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::default_delete<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>_>
            ::get(in_stack_ffffffffffffffe0);
  if (pp_Var1 == (pointer)0x0) {
    in_stack_ffffffffffffffe0 =
         (unique_ptr<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::default_delete<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>_>
          *)(in_RDI + 0x18);
    puVar2 = (undefined8 *)operator_new(8);
    pp_Var3 = __gnu_cxx::
              __normal_iterator<void_(*const_*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::vector<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::allocator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>_>_>
              ::operator*((__normal_iterator<void_(*const_*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::vector<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::allocator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>_>_>
                           *)(in_RDI + 0x10));
    *puVar2 = *pp_Var3;
    std::
    unique_ptr<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::default_delete<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>_>
    ::reset(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  pp_Var1 = std::
            unique_ptr<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_std::default_delete<void_(*const)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>_>
            ::get(in_stack_ffffffffffffffe0);
  return pp_Var1;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }